

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

error_info *
toml::detail::make_syntax_error<toml::detail::character_either>
          (error_info *__return_storage_ptr__,string *title,character_either *scanner,location *loc,
          string *suffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  char *pcVar4;
  size_type *psVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  source_location src;
  size_type *local_1e8;
  size_type local_1d8;
  size_t sStack_1d0;
  size_type *local_1c8;
  size_type local_1c0;
  ulong local_1b8;
  size_t sStack_1b0;
  size_type *local_1a8;
  size_type local_1a0;
  size_type local_198;
  size_t sStack_190;
  undefined1 local_188 [32];
  pointer local_168;
  pointer pbStack_160;
  pointer local_158;
  size_t sStack_150;
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128;
  pointer pbStack_120;
  pointer local_118;
  undefined1 local_110 [104];
  undefined1 local_a8 [32];
  pointer local_88;
  pointer pbStack_80;
  pointer local_78;
  size_t sStack_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  pcVar4 = local_188 + 0x10;
  local_188._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"expected ","");
  character_either::expected_chars_abi_cxx11_((string *)local_110,scanner,loc);
  uVar3 = (long)(_func_int ***)local_110._8_8_ + local_188._8_8_;
  uVar8 = 0xf;
  if ((char *)local_188._0_8_ != pcVar4) {
    uVar8 = local_188._16_8_;
  }
  if (uVar8 < uVar3) {
    uVar8 = 0xf;
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      uVar8 = local_110._16_8_;
    }
    if (uVar3 <= uVar8) {
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,0,0,(char *)local_188._0_8_,local_188._8_8_);
      goto LAB_00380599;
    }
  }
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     (char *)local_110._0_8_,local_110._8_8_);
LAB_00380599:
  local_1e8 = &local_1d8;
  psVar5 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5 == paVar1) {
    local_1d8 = paVar1->_M_allocated_capacity;
    sStack_1d0 = *(size_t *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_1d8 = paVar1->_M_allocated_capacity;
    local_1e8 = psVar5;
  }
  sVar6 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
  }
  if ((char *)local_188._0_8_ != pcVar4) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ + 1);
  }
  region::region((region *)local_110,loc);
  source_location::source_location((source_location *)local_188,(region *)local_110);
  region::~region((region *)local_110);
  local_1a8 = (size_type *)(title->_M_dataplus)._M_p;
  paVar2 = &title->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8 == paVar2) {
    local_198 = paVar2->_M_allocated_capacity;
    sStack_190 = *(size_t *)((long)&title->field_2 + 8);
    local_1a8 = &local_198;
  }
  else {
    local_198 = paVar2->_M_allocated_capacity;
  }
  local_1a0 = title->_M_string_length;
  (title->_M_dataplus)._M_p = (pointer)paVar2;
  title->_M_string_length = 0;
  (title->field_2)._M_local_buf[0] = '\0';
  local_68._M_p = (pointer)&local_58;
  local_78 = local_158;
  sStack_70 = sStack_150;
  local_88 = local_168;
  pbStack_80 = pbStack_160;
  local_a8._16_8_ = local_188._16_8_;
  local_a8._24_8_ = local_188._24_8_;
  local_a8._0_8_ = local_188._0_8_;
  local_a8._8_8_ = local_188._8_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_p == &local_138) {
    local_58._8_8_ = local_138._8_8_;
  }
  else {
    local_68._M_p = local_148._M_p;
  }
  local_60 = local_140;
  local_140 = 0;
  local_138._M_local_buf[0] = '\0';
  local_48 = local_128;
  pbStack_40 = pbStack_120;
  local_38 = local_118;
  local_128 = (pointer)0x0;
  pbStack_120 = (pointer)0x0;
  local_118 = (pointer)0x0;
  if (local_1e8 == &local_1d8) {
    sStack_1b0 = sStack_1d0;
    local_1c8 = &local_1b8;
  }
  else {
    local_1c8 = local_1e8;
  }
  local_1b8 = local_1d8;
  local_1d8 = local_1d8 & 0xffffffffffffff00;
  local_1c0 = sVar6;
  local_148._M_p = (pointer)&local_138;
  make_error_info<std::__cxx11::string>
            (__return_storage_ptr__,(toml *)&local_1a8,(string *)local_a8,
             (source_location *)&local_1c8,suffix,in_R9);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  source_location::~source_location((source_location *)local_a8);
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  source_location::~source_location((source_location *)local_188);
  return __return_storage_ptr__;
}

Assistant:

error_info make_syntax_error(std::string title,
        const S& scanner, location loc, std::string suffix = "")
{
    auto msg = std::string("expected ") + scanner.expected_chars(loc);
    auto src = source_location(region(loc));
    return make_error_info(
        std::move(title), std::move(src), std::move(msg), std::move(suffix));
}